

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_complete_bytecode(sexp ctx)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  sexp psVar3;
  sexp in_RDI;
  sexp bc;
  sexp in_stack_00000010;
  sexp in_stack_00000018;
  sexp in_stack_00000020;
  sexp in_stack_00000028;
  sexp_uint_t in_stack_ffffffffffffffe8;
  sexp local_8;
  
  sexp_emit_return((sexp_conflict)0x146b23);
  sexp_shrink_bcode(in_RDI,in_stack_ffffffffffffffe8);
  local_8 = (((in_RDI->value).opcode.methods)->value).type.cpl;
  if ((((local_8->value).string.offset & 3) == 0) && (((local_8->value).type.cpl)->tag == 6)) {
    if ((((local_8->value).type.cpl)->value).type.cpl == (sexp)0x23e) {
      (local_8->value).type.cpl = (sexp)(((local_8->value).type.cpl)->value).flonum;
    }
    else if ((((((local_8->value).type.cpl)->value).type.cpl)->value).type.cpl == (sexp)0x23e) {
      (((local_8->value).type.cpl)->value).type.cpl =
           (sexp)(((((local_8->value).type.cpl)->value).type.cpl)->value).flonum;
    }
    else {
      psVar3 = sexp_list_to_vector_op
                         (in_stack_00000028,in_stack_00000020,(sexp_sint_t)in_stack_00000018,
                          in_stack_00000010);
      (local_8->value).type.cpl = psVar3;
    }
    if ((((local_8->value).string.offset & 3) == 0) && (((local_8->value).type.cpl)->tag == 0x13)) {
      return (local_8->value).type.cpl;
    }
  }
  uVar1 = (((in_RDI->value).opcode.methods)->value).port.offset;
  auVar2._8_8_ = (long)uVar1 >> 0x3f;
  auVar2._0_8_ = uVar1 & 0xfffffffffffffffe;
  (local_8->value).bytecode.max_depth = SUB168(auVar2 / SEXT816(2),0);
  if ((((local_8->value).type.slots != (sexp)0x0) && (((local_8->value).string.length & 3) == 0)) &&
     (((local_8->value).type.slots)->tag == 6)) {
    psVar3 = sexp_nreverse_op(in_stack_00000018,in_stack_00000010,(sexp_sint_t)ctx,bc);
    (local_8->value).type.slots = psVar3;
    if (((((((((local_8->value).type.slots)->value).string.offset & 3) == 0) &&
          (((((local_8->value).type.slots)->value).type.cpl)->tag == 6)) &&
         ((((((local_8->value).type.slots)->value).stack.length & 3) == 0 &&
          ((((((local_8->value).type.slots)->value).type.name)->tag == 6 &&
           (((((((local_8->value).type.slots)->value).type.name)->value).string.offset & 3) == 0))))
         )) && (((((((local_8->value).type.slots)->value).type.name)->value).type.cpl)->tag == 6))
       && ((((((((((local_8->value).type.slots)->value).type.cpl)->value).stack.length & 3) == 0 &&
             (((((((local_8->value).type.slots)->value).type.cpl)->value).type.name)->tag == 6)) &&
            (((((((((local_8->value).type.slots)->value).type.cpl)->value).type.name)->value).string
              .offset & 3) == 0)) &&
           ((((((((((local_8->value).type.slots)->value).type.cpl)->value).type.name)->value).type.
             cpl)->tag == 6 &&
            ((((((((local_8->value).type.slots)->value).type.name)->value).type.cpl)->value).type.
             name == (((((((((local_8->value).type.slots)->value).type.cpl)->value).type.name)->
                       value).type.cpl)->value).type.name)))))) {
      (local_8->value).type.slots = (((local_8->value).type.slots)->value).type.cpl;
    }
    psVar3 = sexp_list_to_vector_op
                       (in_stack_00000028,in_stack_00000020,(sexp_sint_t)in_stack_00000018,
                        in_stack_00000010);
    (local_8->value).type.slots = psVar3;
  }
  if ((((((in_RDI->value).opcode.methods)->value).port.line & 3) == 0) &&
     (((((in_RDI->value).opcode.methods)->value).type.dl)->tag == 0x13)) {
    local_8 = (((in_RDI->value).opcode.methods)->value).type.dl;
  }
  return local_8;
}

Assistant:

sexp sexp_complete_bytecode (sexp ctx) {
  sexp bc;
  sexp_emit_return(ctx);
  sexp_shrink_bcode(ctx, sexp_unbox_fixnum(sexp_context_pos(ctx)));
  bc = sexp_context_bc(ctx);
  if (sexp_pairp(sexp_bytecode_literals(bc))) { /* compress literals */
    if (sexp_nullp(sexp_cdr(sexp_bytecode_literals(bc))))
      sexp_bytecode_literals(bc) = sexp_car(sexp_bytecode_literals(bc));
    else if (sexp_nullp(sexp_cddr(sexp_bytecode_literals(bc))))
      sexp_cdr(sexp_bytecode_literals(bc)) = sexp_cadr(sexp_bytecode_literals(bc));
    else
      sexp_bytecode_literals(bc) = sexp_list_to_vector(ctx, sexp_bytecode_literals(bc));
    if (sexp_exceptionp(sexp_bytecode_literals(bc)))
      return sexp_bytecode_literals(bc);
  }
  sexp_bytecode_max_depth(bc) = sexp_unbox_fixnum(sexp_context_max_depth(ctx));
#if SEXP_USE_FULL_SOURCE_INFO
  if (sexp_bytecode_source(bc) && sexp_pairp(sexp_bytecode_source(bc))) {
    sexp_bytecode_source(bc) = sexp_nreverse(ctx, sexp_bytecode_source(bc));
    /* omit the leading -1 source marker for the bytecode if the next */
    /* entry is in the same file */
    if (sexp_pairp(sexp_cdr(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_car(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_cdar(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_cadr(sexp_bytecode_source(bc))) &&
        sexp_pairp(sexp_cdr(sexp_cadr(sexp_bytecode_source(bc)))) &&
        sexp_cadr(sexp_car(sexp_bytecode_source(bc)))
        == sexp_cadr(sexp_cadr(sexp_bytecode_source(bc)))) {
      sexp_bytecode_source(bc) = sexp_cdr(sexp_bytecode_source(bc));
    }
    sexp_bytecode_source(bc) = sexp_list_to_vector(ctx, sexp_bytecode_source(bc));
  }
#endif
  sexp_bless_bytecode(ctx, bc);
  if (sexp_exceptionp(sexp_context_exception(ctx)))
    return sexp_context_exception(ctx);
  return bc;
}